

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm_instr.c
# Opt level: O0

void fill_arm_lut(arminstr_handler_t (*lut) [4096])

{
  arm_instr_type_t aVar1;
  long in_RDI;
  arm_instr_type_t type;
  uint32_t i;
  uint local_c;
  
  for (local_c = 0; local_c < 0x1000; local_c = local_c + 1) {
    aVar1 = get_arm_instr_type_hash(local_c);
    switch(aVar1) {
    case DATA_PROCESSING:
      *(code **)(in_RDI + (ulong)local_c * 8) = data_processing;
      break;
    case STATUS_TRANSFER:
      *(code **)(in_RDI + (ulong)local_c * 8) = psr_transfer;
      break;
    case MULTIPLY:
      *(code **)(in_RDI + (ulong)local_c * 8) = multiply;
      break;
    case MULTIPLY_LONG:
      *(code **)(in_RDI + (ulong)local_c * 8) = multiply_long;
      break;
    case SINGLE_DATA_SWAP:
      *(code **)(in_RDI + (ulong)local_c * 8) = single_data_swap;
      break;
    case BRANCH_EXCHANGE:
      *(code **)(in_RDI + (ulong)local_c * 8) = branch_exchange;
      break;
    case HALFWORD_DT_RO:
      *(code **)(in_RDI + (ulong)local_c * 8) = halfword_dt_ro;
      break;
    case HALFWORD_DT_IO:
      *(code **)(in_RDI + (ulong)local_c * 8) = halfword_dt_io;
      break;
    case SINGLE_DATA_TRANSFER:
      *(code **)(in_RDI + (ulong)local_c * 8) = single_data_transfer;
      break;
    case UNDEFINED:
      *(code **)(in_RDI + (ulong)local_c * 8) = unknown_instr_undefined;
      break;
    case BLOCK_DATA_TRANSFER:
      *(code **)(in_RDI + (ulong)local_c * 8) = block_data_transfer;
      break;
    case BRANCH:
      *(code **)(in_RDI + (ulong)local_c * 8) = branch;
      break;
    case COPROCESSOR_DATA_TRANSFER:
      *(code **)(in_RDI + (ulong)local_c * 8) = unknown_instr_coprocessor_data_transfer;
      break;
    case COPROCESSOR_DATA_OPERATION:
      *(code **)(in_RDI + (ulong)local_c * 8) = unknown_instr_coprocessor_data_operation;
      break;
    case COPROCESSOR_REGISTER_TRANSFER:
      *(code **)(in_RDI + (ulong)local_c * 8) = unknown_instr_coprocessor_register_transfer;
      break;
    case SOFTWARE_INTERRUPT:
      *(code **)(in_RDI + (ulong)local_c * 8) = arm_software_interrupt;
      break;
    default:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/arm_instr.c"
              ,0x96);
      fprintf(_stderr,"Hit default case in fill_arm_lut switch. This should never happen!\n\x1b[0;m"
             );
      exit(1);
    }
  }
  return;
}

Assistant:

void fill_arm_lut(arminstr_handler_t (*lut)[4096]) {
    for (word i = 0; i < 4096; i++) {
        arm_instr_type_t type = get_arm_instr_type_hash(i);
        switch (type) {
            case DATA_PROCESSING:
                (*lut)[i] = &data_processing;
                break;
            case STATUS_TRANSFER:
                (*lut)[i] = &psr_transfer;
                break;
            case MULTIPLY:
                (*lut)[i] = &multiply;
                break;
            case MULTIPLY_LONG:
                (*lut)[i] = &multiply_long;
                break;
            case SINGLE_DATA_SWAP:
                (*lut)[i] = &single_data_swap;
                break;
            case BRANCH_EXCHANGE:
                (*lut)[i] = &branch_exchange;
                break;
            case HALFWORD_DT_RO:
                (*lut)[i] = &halfword_dt_ro;
                break;
            case HALFWORD_DT_IO:
                (*lut)[i] = &halfword_dt_io;
                break;
            case SINGLE_DATA_TRANSFER:
                (*lut)[i] = &single_data_transfer;
                break;
            case UNDEFINED:
                (*lut)[i] = &unknown_instr_undefined;
                break;
            case BLOCK_DATA_TRANSFER:
                (*lut)[i] = &block_data_transfer;
                break;
            case BRANCH:
                (*lut)[i] = &branch;
                break;
            case COPROCESSOR_DATA_TRANSFER:
                (*lut)[i] = &unknown_instr_coprocessor_data_transfer;
                break;
            case COPROCESSOR_DATA_OPERATION:
                (*lut)[i] = &unknown_instr_coprocessor_data_operation;
                break;
            case COPROCESSOR_REGISTER_TRANSFER:
                (*lut)[i] = &unknown_instr_coprocessor_register_transfer;
                break;
            case SOFTWARE_INTERRUPT:
                (*lut)[i] = &arm_software_interrupt;
                break;
            default:
                logfatal("Hit default case in fill_arm_lut switch. This should never happen!")
        }
    }
}